

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fAtomicCounterTests.cpp
# Opt level: O1

void deqp::gles31::Functional::anon_unknown_0::AtomicCounterTest::getCountersValues
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *counterValues,
               vector<unsigned_int,_std::allocator<unsigned_int>_> *values,int ndx,int counterCount)

{
  pointer puVar1;
  pointer puVar2;
  uint in_EAX;
  uint uVar3;
  ulong uVar4;
  undefined8 uStack_28;
  
  uStack_28 = (ulong)in_EAX;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            (counterValues,
             (ulong)((long)(values->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(values->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                           ._M_impl.super__Vector_impl_data._M_start >> 2) /
             (ulong)(long)counterCount,(value_type_conflict4 *)((long)&uStack_28 + 4));
  puVar1 = (counterValues->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar3 = (uint)((ulong)((long)(counterValues->
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                               _M_impl.super__Vector_impl_data._M_finish - (long)puVar1) >> 2);
  if (0 < (int)uVar3) {
    puVar2 = (values->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar4 = 0;
    do {
      puVar1[uVar4] = puVar2[ndx];
      uVar4 = uVar4 + 1;
      ndx = ndx + counterCount;
    } while ((uVar3 & 0x7fffffff) != uVar4);
  }
  return;
}

Assistant:

void AtomicCounterTest::getCountersValues (vector<deUint32>& counterValues, const vector<deUint32>& values, int ndx, int counterCount)
{
	counterValues.resize(values.size()/counterCount, 0);

	DE_ASSERT(values.size() % counterCount == 0);

	for (int valueNdx = 0; valueNdx < (int)counterValues.size(); valueNdx++)
		counterValues[valueNdx] = values[valueNdx * counterCount + ndx];
}